

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update3
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double eps2,double *rhs2,int *ridx2,int rn2,double *vec3,double eps3,
          double *rhs3,int *ridx3,int rn3,double *forest,int *forestNum,int *forestIdx)

{
  double dVar1;
  int *piVar2;
  double *vec_00;
  double *vec_01;
  CLUFactor<double> *this_00;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qb;
  int j;
  int rn_local;
  double local_88;
  int local_7c;
  double *local_78;
  CLUFactor<double> *local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  int *local_38;
  
  rn_local = rn;
  local_88 = eps;
  local_78 = vec;
  local_68 = eps2;
  uStack_60 = in_XMM1_Qb;
  local_58 = eps3;
  uStack_50 = in_XMM2_Qb;
  local_38 = idx;
  vSolveLright3(this,rhs,ridx,&rn_local,eps,rhs2,ridx2,&rn2,eps2,rhs3,ridx3,&rn3,eps3);
  local_70 = this;
  if (forest == (double *)0x0) {
    piVar2 = (this->row).perm;
    j = 0;
    lVar6 = (long)rn_local;
    dVar9 = local_88;
    for (lVar7 = 0; lVar7 < lVar6; lVar7 = lVar7 + 1) {
      iVar3 = ridx[lVar7];
      if (ABS(rhs[iVar3]) <= dVar9) {
        rhs[iVar3] = 0.0;
      }
      else {
        enQueueMax(ridx,&j,piVar2[iVar3]);
        dVar9 = local_88;
      }
    }
  }
  else {
    piVar2 = (this->row).perm;
    j = 0;
    piVar4 = forestIdx;
    dVar9 = local_88;
    for (lVar7 = 0; lVar7 < rn_local; lVar7 = lVar7 + 1) {
      iVar3 = ridx[lVar7];
      dVar1 = rhs[iVar3];
      if (ABS(dVar1) <= dVar9) {
        rhs[iVar3] = 0.0;
      }
      else {
        *piVar4 = iVar3;
        piVar4 = piVar4 + 1;
        local_48._8_8_ = 0;
        local_48._0_8_ = dVar1;
        enQueueMax(ridx,&j,piVar2[iVar3]);
        forest[iVar3] = (double)local_48._0_8_;
        dVar9 = local_88;
      }
    }
    *forestNum = j;
  }
  rn_local = j;
  if ((double)rn2 <= (double)local_70->thedim * 0.2) {
    piVar2 = (local_70->row).perm;
    j = 0;
    local_48._8_4_ = (int)uStack_60;
    local_48._0_8_ = -local_68;
    local_48._12_4_ = (uint)((ulong)uStack_60 >> 0x20) ^ 0x80000000;
    uVar5 = 0;
    uVar8 = (ulong)(uint)rn2;
    dVar9 = local_68;
    local_7c = rn_local;
    if (rn2 < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = ridx2[uVar5];
      if ((double)local_48._0_8_ <= rhs2[iVar3]) {
        if (dVar9 < rhs2[iVar3]) {
          iVar3 = piVar2[iVar3];
          goto LAB_001aa6d9;
        }
        rhs2[iVar3] = 0.0;
      }
      else {
        iVar3 = piVar2[iVar3];
LAB_001aa6d9:
        enQueueMax(ridx2,&j,iVar3);
        dVar9 = local_68;
      }
    }
    rn2 = j;
  }
  else {
    *ridx2 = local_70->thedim + -1;
    local_7c = j;
  }
  if ((double)rn3 <= (double)local_70->thedim * 0.2) {
    piVar2 = (local_70->row).perm;
    j = 0;
    local_48._8_4_ = (int)uStack_50;
    local_48._0_8_ = -local_58;
    local_48._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ 0x80000000;
    uVar5 = 0;
    uVar8 = (ulong)(uint)rn3;
    dVar9 = local_58;
    if (rn3 < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = ridx3[uVar5];
      if ((rhs3[iVar3] < (double)local_48._0_8_) || (dVar9 < rhs3[iVar3])) {
        enQueueMax(ridx3,&j,piVar2[iVar3]);
        dVar9 = local_58;
      }
      else {
        rhs3[iVar3] = 0.0;
      }
    }
    rn3 = j;
  }
  else {
    *ridx3 = local_70->thedim + -1;
  }
  piVar4 = local_38;
  this_00 = local_70;
  vec_01 = local_78;
  piVar2 = ridx3;
  rn_local = vSolveUright(local_70,local_78,local_38,rhs,ridx,local_7c,local_88);
  vSolveUrightNoNZ(this_00,vec2,rhs2,ridx2,rn2,local_68);
  vec_00 = vec3;
  vSolveUrightNoNZ(this_00,vec3,rhs3,piVar2,rn3,local_58);
  if ((this_00->l).updateType == 0) {
    rn_local = vSolveUpdateRight(this_00,vec_01,piVar4,rn_local,local_88);
    vSolveUpdateRightNoNZ(this_00,vec2,local_68);
    vSolveUpdateRightNoNZ(this_00,vec_00,local_58);
  }
  return rn_local;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}